

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::MergePartialFromCodedStream
          (WordEmbedding *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  int64 iVar7;
  char cVar8;
  ulong uVar9;
  string *psVar10;
  
  this_00 = &this->modelparameterdata_;
  this_01 = &this->language_;
LAB_003beabf:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar9 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_003bec1f;
        uVar9 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar9 = uVar9 | 0x100000000;
    }
    else {
LAB_003bec1f:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto LAB_003beb1c;
    uVar5 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar9;
    if (uVar5 == 100) {
      if (cVar8 != '\"') goto LAB_003beb1c;
      psVar10 = this_00->ptr_;
      if (psVar10 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar10 = this_00->ptr_;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar10);
LAB_003beb3d:
      if (bVar4 == false) {
        return false;
      }
      goto LAB_003beabf;
    }
    if (uVar5 == 10) {
      if (cVar8 != 'R') {
LAB_003beb1c:
        if (uVar6 == 0) {
          return true;
        }
        if ((uVar6 & 7) == 4) {
          return true;
        }
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
        goto LAB_003beb3d;
      }
      psVar10 = this_01->ptr_;
      if (psVar10 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_01,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar10 = this_01->ptr_;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar10);
      if (!bVar4) {
        return false;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,
                         PARSE,"CoreML.Specification.CoreMLModels.WordEmbedding.language");
      if (!bVar4) {
        return false;
      }
      goto LAB_003beabf;
    }
    if ((uVar5 != 1) || (cVar8 != '\b')) goto LAB_003beb1c;
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar6 = (uint32)bVar2;
      if (-1 < (char)bVar2) {
        this->revision_ = (uint)bVar2;
        input->buffer_ = pbVar3 + 1;
        goto LAB_003beabf;
      }
    }
    else {
      uVar6 = 0;
    }
    iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
    this->revision_ = (uint32)iVar7;
    if (iVar7 < 0) {
      return false;
    }
  } while( true );
}

Assistant:

bool WordEmbedding::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordEmbedding.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.WordEmbedding)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.WordEmbedding)
  return false;
#undef DO_
}